

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O2

void nn_pipebase_init(nn_pipebase *self,nn_pipebase_vfptr *vfptr,nn_ep *ep)

{
  int iVar1;
  
  if (ep->sock != (nn_sock *)0x0) {
    nn_fsm_init(&self->fsm,(nn_fsm_fn)0x0,(nn_fsm_fn)0x0,0,self,&ep->sock->fsm);
    self->vfptr = vfptr;
    self->state = '\x01';
    self->instate = '\0';
    self->outstate = '\0';
    self->sock = ep->sock;
    iVar1 = (ep->options).rcvprio;
    (self->options).sndprio = (ep->options).sndprio;
    (self->options).rcvprio = iVar1;
    (self->options).ipv4only = (ep->options).ipv4only;
    nn_fsm_event_init(&self->in);
    nn_fsm_event_init(&self->out);
    return;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","ep->sock",
          "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/pipe.c"
          ,0x35);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void nn_pipebase_init (struct nn_pipebase *self,
    const struct nn_pipebase_vfptr *vfptr, struct nn_ep *ep)
{
    nn_assert (ep->sock);

    nn_fsm_init (&self->fsm, NULL, NULL, 0, self, &ep->sock->fsm);
    self->vfptr = vfptr;
    self->state = NN_PIPEBASE_STATE_IDLE;
    self->instate = NN_PIPEBASE_INSTATE_DEACTIVATED;
    self->outstate = NN_PIPEBASE_OUTSTATE_DEACTIVATED;
    self->sock = ep->sock;
    memcpy (&self->options, &ep->options, sizeof (struct nn_ep_options));
    nn_fsm_event_init (&self->in);
    nn_fsm_event_init (&self->out);
}